

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O0

void __thiscall
cppcms::http::cookie::cookie
          (cookie *this,string *name,string *value,string *path,string *domain,string *comment)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  copy_ptr<cppcms::http::cookie::_data> *in_RDI;
  string *in_R8;
  string *in_R9;
  
  booster::copy_ptr<cppcms::http::cookie::_data>::copy_ptr(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 9),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0xd),in_R8);
  std::__cxx11::string::string((string *)(in_RDI + 0x11),in_R9);
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffe;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffd;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffb;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffff7;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffef;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffdf;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffbf;
  return;
}

Assistant:

cookie::cookie(std::string name,std::string value,std::string path,std::string domain,std::string comment) :
	name_(name), value_(value), path_(path),domain_(domain),comment_(comment), secure_(0), has_age_(0), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0)
{
}